

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ATTRIBUTE *pAVar6;
  
  lVar2 = -(long)ptr;
  do {
    pcVar5 = end + lVar2;
    if ((long)pcVar5 < 1) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    pAVar6 = (ATTRIBUTE *)(ulong)bVar1;
    if (pAVar6 < (ATTRIBUTE *)0xe) {
      switch(pAVar6) {
      case (ATTRIBUTE *)0x0:
      case (ATTRIBUTE *)0x1:
      case (ATTRIBUTE *)0x8:
switchD_0045c80c_caseD_0:
        *nextTokPtr = ptr;
        return 0;
      default:
        goto switchD_0045c80c_caseD_2;
      case (ATTRIBUTE *)0x5:
        if (pcVar5 == (char *)0x1) {
          return -2;
        }
        iVar3 = (*enc[3].nameLength)(enc,ptr);
        if (iVar3 != 0) goto switchD_0045c80c_caseD_0;
        ptr = (char *)((byte *)ptr + 2);
        break;
      case (ATTRIBUTE *)0x6:
        if (pcVar5 < (char *)0x3) {
          return -2;
        }
        pcVar5 = (*enc[3].skipS)(enc,ptr);
        if ((int)pcVar5 != 0) goto switchD_0045c80c_caseD_0;
        ptr = (char *)((byte *)ptr + 3);
        break;
      case (ATTRIBUTE *)0x7:
        if (pcVar5 < (char *)0x4) {
          return -2;
        }
        iVar3 = (*enc[3].getAtts)(enc,ptr,(&switchD_0045c80c::switchdataD_005d3d0c)[(long)pAVar6] +
                                          0x5d3d0c,pAVar6);
        if (iVar3 != 0) goto switchD_0045c80c_caseD_0;
        ptr = (char *)((byte *)ptr + 4);
        break;
      case (ATTRIBUTE *)0xc:
      case (ATTRIBUTE *)0xd:
        ptr = (char *)((byte *)ptr + 1);
        if ((uint)bVar1 == open) {
          if (end == ptr || (long)end - (long)ptr < 0) {
            return -0x1b;
          }
          *nextTokPtr = ptr;
          uVar4 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
          if (0x1e < uVar4) {
            return 0;
          }
          if ((0x40300e00U >> (uVar4 & 0x1f) & 1) == 0) {
            return 0;
          }
          return 0x1b;
        }
      }
    }
    else {
switchD_0045c80c_caseD_2:
      ptr = (char *)((byte *)ptr + 1);
    }
    lVar2 = -(long)ptr;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc,
                const char *ptr, const char *end,
                const char **nextTokPtr)
{
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}